

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

opStatus __thiscall
llvm::detail::DoubleAPFloat::addImpl
          (DoubleAPFloat *this,APFloat *a,APFloat *aa,APFloat *c,APFloat *cc,roundingMode RM)

{
  Storage *pSVar1;
  IEEEFloat *this_00;
  APFloat *pAVar2;
  opStatus oVar3;
  cmpResult cVar4;
  opStatus oVar5;
  opStatus oVar6;
  opStatus oVar7;
  opStatus oVar8;
  opStatus oVar9;
  opStatus oVar10;
  opStatus oVar11;
  opStatus oVar12;
  Storage *pSVar13;
  undefined8 uVar14;
  APFloat *pAVar15;
  APFloat z;
  APFloat q;
  APFloat zz;
  undefined1 local_90 [8];
  Storage local_88;
  undefined1 local_70 [8];
  Storage local_68;
  undefined1 local_50 [8];
  Storage local_48;
  
  pSVar1 = &a->U;
  if ((a->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)(local_90 + 8),(DoubleAPFloat *)&pSVar1->IEEE);
  }
  else {
    IEEEFloat::IEEEFloat((IEEEFloat *)(local_90 + 8),&pSVar1->IEEE);
  }
  oVar3 = APFloat::add((APFloat *)local_90,c,RM);
  uVar14 = local_90;
  if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
    uVar14 = local_88.IEEE.significand;
  }
  if ((*(byte *)(uVar14 + 0x1a) & 6) == 0) {
    if ((*(byte *)(uVar14 + 0x1a) & 1) == 0) {
      cVar4 = APFloat::compareAbsoluteValue(a,c);
      APFloat::Storage::operator=((Storage *)&((Storage *)(local_90 + 8))->IEEE,&cc->U);
      oVar3 = APFloat::add((APFloat *)local_90,aa,RM);
      pAVar15 = c;
      pAVar2 = a;
      if (cVar4 == cmpGreaterThan) {
        pAVar15 = a;
        pAVar2 = c;
      }
      oVar5 = APFloat::add((APFloat *)local_90,pAVar2,RM);
      oVar6 = APFloat::add((APFloat *)local_90,pAVar15,RM);
      uVar14 = local_90;
      if (local_88.semantics == (fltSemantics *)semPPCDoubleDouble) {
        uVar14 = local_88.IEEE.significand;
      }
      oVar3 = oVar6 | oVar5 | oVar3;
      pSVar13 = &((this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
      if ((*(byte *)(uVar14 + 0x1a) & 6) == 0) {
        APFloat::Storage::operator=((Storage *)&pSVar13->IEEE,(Storage *)(local_90 + 8));
        APFloat::makeZero((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
      }
      else {
        APFloat::Storage::operator=((Storage *)&pSVar13->IEEE,(Storage *)(local_90 + 8));
        if ((aa->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
          DoubleAPFloat((DoubleAPFloat *)(local_70 + 8),(DoubleAPFloat *)&(aa->U).IEEE);
        }
        else {
          IEEEFloat::IEEEFloat((IEEEFloat *)(local_70 + 8),&(aa->U).IEEE);
        }
        oVar5 = APFloat::add((APFloat *)local_70,cc,RM);
        pSVar13 = &c->U;
        if (cVar4 == cmpGreaterThan) {
          a = c;
          pSVar13 = pSVar1;
        }
        APFloat::Storage::operator=
                  ((Storage *)
                   &(this->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,pSVar13);
        oVar6 = APFloat::subtract((this->Floats)._M_t.
                                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                                  .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                                  (APFloat *)local_90,RM);
        oVar7 = APFloat::add((this->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,a,RM);
        oVar8 = APFloat::add((this->Floats)._M_t.
                             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                             .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                             (APFloat *)local_70,RM);
        oVar3 = oVar3 | oVar8 | oVar5 | oVar7 | oVar6;
        APFloat::Storage::~Storage((Storage *)(local_70 + 8));
      }
    }
    else {
      APFloat::Storage::operator=
                ((Storage *)
                 &(((this->Floats)._M_t.
                    super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t
                    .super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                    super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,
                 (Storage *)(local_90 + 8));
      APFloat::makeZero((this->Floats)._M_t.
                        super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                        .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,false);
    }
    goto LAB_00170ccf;
  }
  this_00 = (IEEEFloat *)(local_70 + 8);
  if (pSVar1->semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)this_00,(DoubleAPFloat *)&pSVar1->IEEE);
  }
  else {
    IEEEFloat::IEEEFloat(this_00,&pSVar1->IEEE);
  }
  oVar5 = APFloat::subtract((APFloat *)local_70,(APFloat *)local_90,RM);
  if (local_68.semantics == (fltSemantics *)semPPCDoubleDouble) {
    DoubleAPFloat((DoubleAPFloat *)(local_50 + 8),(DoubleAPFloat *)this_00);
  }
  else {
    IEEEFloat::IEEEFloat((IEEEFloat *)(local_50 + 8),this_00);
  }
  oVar6 = APFloat::add((APFloat *)local_50,c,RM);
  oVar7 = APFloat::add((APFloat *)local_70,(APFloat *)local_90,RM);
  oVar8 = APFloat::subtract((APFloat *)local_70,a,RM);
  APFloat::changeSign((APFloat *)local_70);
  oVar9 = APFloat::add((APFloat *)local_50,(APFloat *)local_70,RM);
  oVar10 = APFloat::add((APFloat *)local_50,aa,RM);
  oVar11 = APFloat::add((APFloat *)local_50,cc,RM);
  uVar14 = local_50;
  if (local_48.semantics == (fltSemantics *)semPPCDoubleDouble) {
    uVar14 = local_48.IEEE.significand;
  }
  pSVar13 = &((this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U;
  pSVar1 = (Storage *)(local_90 + 8);
  if ((*(byte *)(uVar14 + 0x1a) & 0xf) == 3) {
    APFloat::Storage::operator=((Storage *)&pSVar13->IEEE,pSVar1);
    pAVar15 = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    oVar3 = opOK;
LAB_00170cb1:
    APFloat::makeZero(pAVar15 + 1,false);
  }
  else {
    APFloat::Storage::operator=((Storage *)&pSVar13->IEEE,pSVar1);
    oVar12 = APFloat::add((this->Floats)._M_t.
                          super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                          .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl,
                          (APFloat *)local_50,RM);
    oVar3 = oVar9 | oVar10 | oVar11 | oVar7 | oVar8 | oVar5 | oVar6 | oVar3 | oVar12;
    pAVar15 = (this->Floats)._M_t.
              super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
              super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
              super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    pAVar2 = (APFloat *)(pAVar15->U).IEEE.significand.part;
    if ((pAVar15->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
      pAVar2 = pAVar15;
    }
    if ((*(undefined1 *)((long)&pAVar2->U + 0x12) & 6) == 0) goto LAB_00170cb1;
    APFloat::Storage::operator=((Storage *)&pAVar15[1].U.IEEE,pSVar1);
    pAVar2 = (this->Floats)._M_t.
             super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
             super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
             super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl;
    oVar5 = APFloat::subtract(pAVar2 + 1,pAVar2,RM);
    oVar6 = APFloat::add((this->Floats)._M_t.
                         super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>
                         .super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl + 1,
                         (APFloat *)local_50,RM);
    oVar3 = oVar3 | oVar6 | oVar5;
  }
  APFloat::Storage::~Storage((Storage *)(local_50 + 8));
  APFloat::Storage::~Storage((Storage *)(local_70 + 8));
LAB_00170ccf:
  APFloat::Storage::~Storage((Storage *)(local_90 + 8));
  return oVar3;
}

Assistant:

APFloat::opStatus DoubleAPFloat::addImpl(const APFloat &a, const APFloat &aa,
                                         const APFloat &c, const APFloat &cc,
                                         roundingMode RM) {
  int Status = opOK;
  APFloat z = a;
  Status |= z.add(c, RM);
  if (!z.isFinite()) {
    if (!z.isInfinity()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Status = opOK;
    auto AComparedToC = a.compareAbsoluteValue(c);
    z = cc;
    Status |= z.add(aa, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // z = cc + aa + c + a;
      Status |= z.add(c, RM);
      Status |= z.add(a, RM);
    } else {
      // z = cc + aa + a + c;
      Status |= z.add(a, RM);
      Status |= z.add(c, RM);
    }
    if (!z.isFinite()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[0] = z;
    APFloat zz = aa;
    Status |= zz.add(cc, RM);
    if (AComparedToC == APFloat::cmpGreaterThan) {
      // Floats[1] = a - z + c + zz;
      Floats[1] = a;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(c, RM);
      Status |= Floats[1].add(zz, RM);
    } else {
      // Floats[1] = c - z + a + zz;
      Floats[1] = c;
      Status |= Floats[1].subtract(z, RM);
      Status |= Floats[1].add(a, RM);
      Status |= Floats[1].add(zz, RM);
    }
  } else {
    // q = a - z;
    APFloat q = a;
    Status |= q.subtract(z, RM);

    // zz = q + c + (a - (q + z)) + aa + cc;
    // Compute a - (q + z) as -((q + z) - a) to avoid temporary copies.
    auto zz = q;
    Status |= zz.add(c, RM);
    Status |= q.add(z, RM);
    Status |= q.subtract(a, RM);
    q.changeSign();
    Status |= zz.add(q, RM);
    Status |= zz.add(aa, RM);
    Status |= zz.add(cc, RM);
    if (zz.isZero() && !zz.isNegative()) {
      Floats[0] = std::move(z);
      Floats[1].makeZero(/* Neg = */ false);
      return opOK;
    }
    Floats[0] = z;
    Status |= Floats[0].add(zz, RM);
    if (!Floats[0].isFinite()) {
      Floats[1].makeZero(/* Neg = */ false);
      return (opStatus)Status;
    }
    Floats[1] = std::move(z);
    Status |= Floats[1].subtract(Floats[0], RM);
    Status |= Floats[1].add(zz, RM);
  }
  return (opStatus)Status;
}